

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O1

int GetMsgSeanet(SEANET *pSeanet,int mid,uchar *databuf,int databuflen,int *pNbdatabytes)

{
  uchar *__dest;
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  ulong uVar4;
  long *plVar5;
  uint uVar6;
  char *__s;
  uint uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int len;
  char szHexLength [5];
  int remainingdatalen;
  uchar *ptr;
  uchar *remainingdata;
  CHRONO chrono;
  uchar recvbuf [2048];
  uint local_8c4;
  timespec local_8c0;
  int local_8b0;
  int local_8ac;
  uint local_8a8;
  int local_8a4;
  uchar *local_8a0;
  uint *local_898;
  uchar *local_890;
  uchar *local_888;
  timespec local_880;
  undefined8 local_870;
  undefined8 uStack_868;
  ulong local_860;
  long lStack_858;
  timespec local_850;
  int local_840;
  uchar local_838;
  undefined4 local_837;
  ushort auStack_833 [2];
  uchar auStack_82e [2046];
  
  local_8a0 = (uchar *)0x0;
  local_8c4 = 0;
  local_888 = (uchar *)0x0;
  local_8ac = 0;
  local_8b0 = mid;
  iVar1 = clock_getres(4,&local_850);
  if ((iVar1 == 0) && (iVar1 = clock_gettime(4,&local_880), iVar1 == 0)) {
    local_840 = 0;
    local_870 = 0;
    uStack_868 = 0;
    local_860 = 0;
    lStack_858 = 0;
  }
  uVar10 = 0;
  memset(&local_838,0,0x800);
  iVar1 = (pSeanet->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (pSeanet->RS232Port).s;
    do {
      sVar3 = recv(iVar1,&local_838 + uVar10,(long)(0xb - (int)uVar10),0);
      if ((int)sVar3 < 1) goto LAB_001a3944;
      uVar6 = (int)uVar10 + (int)sVar3;
      uVar10 = (ulong)uVar6;
    } while ((int)uVar6 < 0xb);
LAB_001a3631:
    local_8a4 = databuflen;
    local_898 = (uint *)pNbdatabytes;
    local_890 = databuf;
    uVar10 = 0xb;
    lVar8 = 0;
    do {
      if ((&local_838)[lVar8] == '@') {
        local_8a8 = 0;
        local_8c0.tv_sec =
             CONCAT44((int)((ulong)local_8c0.tv_sec >> 0x20),
                      *(undefined4 *)((long)auStack_833 + lVar8 + -4)) & 0xffffff00ffffffff;
        iVar1 = __isoc99_sscanf(&local_8c0,"%x",&local_8a8);
        uVar6 = 0;
        if (iVar1 == 1) {
          uVar6 = local_8a8;
        }
        if ((uVar6 == *(ushort *)((long)auStack_833 + lVar8)) &&
           (auStack_82e[lVar8] == (uchar)local_8b0)) {
          local_8c4 = uVar6 + 6;
          if (0x7ff < (int)(uVar6 + (int)lVar8 + 6)) goto LAB_001a3931;
          if ((int)uVar6 < 6) goto LAB_001a3901;
          uVar6 = uVar6 - 5;
          iVar1 = (pSeanet->RS232Port).DevType;
          if (iVar1 - 1U < 4) {
            iVar1 = (pSeanet->RS232Port).s;
            uVar4 = 0;
            goto LAB_001a38a9;
          }
          if (iVar1 == 0) {
            iVar1 = *(int *)&(pSeanet->RS232Port).hDev;
            uVar4 = 0;
            goto LAB_001a38da;
          }
          goto LAB_001a3944;
        }
      }
      if (local_840 == 0) {
        clock_gettime(4,&local_8c0);
        local_8c0.tv_sec =
             (local_8c0.tv_sec + local_860 + (local_8c0.tv_nsec + lStack_858) / 1000000000) -
             local_880.tv_sec;
        local_8c0.tv_nsec = (local_8c0.tv_nsec + lStack_858) % 1000000000 - local_880.tv_nsec;
        if (local_8c0.tv_nsec < 0) {
          local_8c0.tv_sec = (local_8c0.tv_sec + local_8c0.tv_nsec / 1000000000) - 1;
          local_8c0.tv_nsec = local_8c0.tv_nsec % 1000000000 + 1000000000;
        }
        plVar5 = &local_8c0.tv_nsec;
        uVar4 = local_8c0.tv_sec;
      }
      else {
        plVar5 = &lStack_858;
        uVar4 = local_860;
      }
      if (4.0 < (double)*plVar5 / 1000000000.0 + (double)(long)uVar4) {
        puts("Error reading data from a Seanet : Message timeout. ");
        return 2;
      }
      if (lVar8 == 0x7f4) goto LAB_001a3931;
      iVar1 = (pSeanet->RS232Port).DevType;
      if (iVar1 - 1U < 4) {
        iVar1 = (pSeanet->RS232Port).s;
        uVar4 = 0;
        do {
          iVar9 = (int)uVar4;
          sVar3 = recv(iVar1,&local_838 + uVar4 + uVar10,(long)(1 - iVar9),0);
          iVar2 = (int)sVar3;
          if (iVar2 < 1) goto LAB_001a3944;
          uVar6 = iVar9 + iVar2;
          uVar4 = (ulong)uVar6;
        } while (uVar6 == 0 || SCARRY4(iVar9,iVar2) != (int)uVar6 < 0);
      }
      else {
        if (iVar1 != 0) goto LAB_001a3944;
        iVar1 = *(int *)&(pSeanet->RS232Port).hDev;
        uVar4 = 0;
        do {
          sVar3 = read(iVar1,&local_838 + uVar4 + uVar10,(ulong)(1 - (int)uVar4));
          if ((int)sVar3 < 1) goto LAB_001a3944;
          uVar6 = (int)uVar4 + (int)sVar3;
          uVar4 = (ulong)uVar6;
        } while (uVar6 == 0);
      }
      uVar10 = uVar10 + 1;
      lVar8 = lVar8 + 1;
    } while( true );
  }
  if (iVar1 == 0) {
    iVar1 = *(int *)&(pSeanet->RS232Port).hDev;
    uVar10 = 0;
    do {
      sVar3 = read(iVar1,&local_838 + uVar10,(ulong)(0xb - (int)uVar10));
      if ((int)sVar3 < 1) goto LAB_001a3944;
      uVar6 = (int)uVar10 + (int)sVar3;
      uVar10 = (ulong)uVar6;
    } while (uVar6 < 0xb);
    goto LAB_001a3631;
  }
LAB_001a3944:
  __s = "Error reading data from a Seanet. ";
  goto LAB_001a394b;
  while (uVar7 = (int)uVar4 + (int)sVar3, uVar4 = (ulong)uVar7, (int)uVar7 < (int)uVar6) {
LAB_001a38a9:
    sVar3 = recv(iVar1,&local_838 + uVar4 + (uVar10 & 0xffffffff),(long)(int)(uVar6 - (int)uVar4),0)
    ;
    if ((int)sVar3 < 1) goto LAB_001a3944;
  }
  goto LAB_001a38f9;
  while (uVar7 = (int)uVar4 + (int)sVar3, uVar4 = (ulong)uVar7, uVar7 < uVar6) {
LAB_001a38da:
    sVar3 = read(iVar1,&local_838 + uVar4 + (uVar10 & 0xffffffff),(ulong)(uVar6 - (int)uVar4));
    if ((int)sVar3 < 1) goto LAB_001a3944;
  }
LAB_001a38f9:
  uVar10 = (ulong)((int)lVar8 + local_8c4);
LAB_001a3901:
  iVar1 = FindLatestMsgWithMIDSeanet
                    (&local_838,(int)uVar10,local_8b0,&local_8a0,(int *)&local_8c4,&local_888,
                     &local_8ac);
  if (iVar1 == 0) {
    if (0 < local_8ac) {
      puts("Error getting data from a Seanet : Unexpected data after a message. ");
    }
    __dest = local_890;
    iVar1 = local_8a4;
    memset(local_890,0,(long)local_8a4);
    *local_898 = local_8c4;
    if (iVar1 < (int)local_8c4) {
      __s = "Error getting data from a Seanet : Too small data buffer. ";
LAB_001a394b:
      puts(__s);
      iVar1 = 1;
    }
    else {
      iVar1 = 0;
      if (0 < (int)local_8c4) {
        memcpy(__dest,local_8a0,(ulong)local_8c4);
        iVar1 = 0;
      }
    }
  }
  else {
LAB_001a3931:
    puts("Error reading data from a Seanet : Invalid data. ");
    iVar1 = 4;
  }
  return iVar1;
}

Assistant:

inline int GetMsgSeanet(SEANET* pSeanet, int mid, unsigned char* databuf, int databuflen, int* pNbdatabytes)
{
	unsigned char recvbuf[MAX_NB_BYTES_SEANET];
	int i = 0;
	int BytesReceived = 0, recvbuflen = 0;
	unsigned char* ptr = NULL;
	int len = 0;
	unsigned char* remainingdata = NULL;
	int remainingdatalen = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_SEANET-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired message...

	if (ReadAllRS232Port(&pSeanet->RS232Port, recvbuf, MIN_MESSAGE_LEN_SEANET) != EXIT_SUCCESS)
	{
		printf("Error reading data from a Seanet. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += MIN_MESSAGE_LEN_SEANET;

	i = 0;
	while (AnalyseBufHdrHexBinLenMIDSeanet(recvbuf+i, BytesReceived-i, mid, &len) != EXIT_SUCCESS)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_SEANET)
		{
			printf("Error reading data from a Seanet : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		if (BytesReceived+1 > recvbuflen)
		{
			printf("Error reading data from a Seanet : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&pSeanet->RS232Port, recvbuf+BytesReceived, 1) != EXIT_SUCCESS)
		{
			printf("Error reading data from a Seanet. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += 1;
		i++;
	}

	// Notes :
	// BytesReceived+len-(BytesReceived-i) = len+i
	// BytesReceived = MIN_MESSAGE_LEN_SEANET+i
	// len-MIN_MESSAGE_LEN_SEANET = len-(BytesReceived-i)
	if (len+i > recvbuflen)
	{
		printf("Error reading data from a Seanet : Invalid data. \n");
		return EXIT_INVALID_DATA;
	}

	// Read the remaining bytes of the message according to the length found.
	if (len-(BytesReceived-i) > 0)
	{
		if (ReadAllRS232Port(&pSeanet->RS232Port, recvbuf+BytesReceived, len-(BytesReceived-i)) != EXIT_SUCCESS)
		{
			printf("Error reading data from a Seanet. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += (len-(BytesReceived-i));
	}

	if (FindLatestMsgWithMIDSeanet(recvbuf, BytesReceived, mid, 
		&ptr, &len, &remainingdata, &remainingdatalen) != EXIT_SUCCESS)
	{
		printf("Error reading data from a Seanet : Invalid data. \n");
		return EXIT_INVALID_DATA;
	}

	if (remainingdatalen > 0)
	{
		printf("Error getting data from a Seanet : Unexpected data after a message. \n");
	}

	// Get data bytes.

	memset(databuf, 0, databuflen);
	*pNbdatabytes = len;

	// Check the number of data bytes before copy.
	if (databuflen < *pNbdatabytes)
	{
		printf("Error getting data from a Seanet : Too small data buffer. \n");
		return EXIT_FAILURE;
	}

	// Copy the data bytes of the message.
	if (*pNbdatabytes > 0)
	{
		memcpy(databuf, ptr, *pNbdatabytes);
	}

	return EXIT_SUCCESS;
}